

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::store_array_text<embree::Vec2<float>>
          (XMLWriter *this,char *name,
          vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *vec)

{
  pointer pVVar1;
  int __oflag;
  ulong uVar2;
  ulong uVar3;
  allocator local_79;
  char *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::string((string *)local_50,name,&local_79);
  open(this,(char *)local_50,__oflag);
  local_78 = name;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pVVar1 = (vec->super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    uVar2 = 0;
    do {
      if (this->ident != 0) {
        uVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
          uVar3 = uVar3 + 1;
        } while (uVar3 < this->ident);
        pVVar1 = (vec->
                 super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      }
      store_array_elt(this,pVVar1 + uVar2);
      uVar2 = uVar2 + 1;
      pVVar1 = (vec->super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(vec->
                                   super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3))
    ;
  }
  std::__cxx11::string::string((string *)local_70,local_78,&local_79);
  close(this,(int)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }